

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  pointer pcVar3;
  pointer pbVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  size_type sVar7;
  char cVar8;
  int iVar9;
  OptionAdder *pOVar10;
  ostream *poVar11;
  const_iterator cVar12;
  OptionDetails *pOVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar15;
  int *piVar16;
  undefined8 *in_RSI;
  pointer pbVar17;
  char *pcVar18;
  int in_EDI;
  undefined4 uVar19;
  Information *device;
  Options *pOVar20;
  _Alloc_hider _Var21;
  long lVar22;
  ulong uVar23;
  bool bVar24;
  bool bVar25;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  uint role;
  FunKeyMonkeyModule module;
  vector<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_> inputs;
  vector<unsigned_int,_std::allocator<unsigned_int>_> deviceRoles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  moduleArgs;
  vector<EvdevDevice::Information,_std::allocator<EvdevDevice::Information>_> devices_1;
  Options options;
  OptionException e;
  string local_cb8;
  undefined1 local_c98 [16];
  undefined1 local_c88 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c58;
  undefined1 local_c48 [16];
  undefined1 local_c38 [16];
  _Base_ptr local_c28 [3];
  string local_c10;
  string local_bf0;
  string local_bd0;
  Options *local_bb0;
  pointer local_ba8;
  undefined1 local_ba0 [64];
  undefined1 local_b60 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_b58;
  _Base_ptr local_b50;
  _Base_ptr p_Stack_b48;
  _Base_ptr local_b40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_b38;
  _Alloc_hider local_b30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_b28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b20;
  element_type *local_b10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_b08;
  _Base_ptr local_b00;
  _Base_ptr p_Stack_af8;
  _Rb_tree_node_base *local_af0;
  size_t local_ae8;
  undefined1 local_ae0 [32];
  _Rb_tree_node_base local_ac0;
  undefined1 local_aa0 [24];
  _Rb_tree_node_base local_a88;
  undefined8 local_a68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a60;
  undefined8 local_a58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a50;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails>_>_>
  local_a40;
  pointer local_a10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a08;
  shared_ptr<const_cxxopts::Value> local_a00;
  shared_ptr<const_cxxopts::Value> local_9f0;
  shared_ptr<const_cxxopts::Value> local_9e0;
  shared_ptr<const_cxxopts::Value> local_9d0;
  shared_ptr<const_cxxopts::Value> local_9c0;
  shared_ptr<const_cxxopts::Value> local_9b0;
  shared_ptr<const_cxxopts::Value> local_9a0;
  shared_ptr<const_cxxopts::Value> local_990;
  shared_ptr<const_cxxopts::Value> local_980;
  shared_ptr<const_cxxopts::Value> local_970;
  _Base_ptr local_960;
  undefined8 local_958;
  undefined1 local_950 [24];
  string local_938;
  string local_918;
  string local_8f8;
  string local_8d8;
  string local_8b8;
  string local_898;
  string local_878;
  string local_858;
  string local_838;
  string local_818;
  string local_7f8;
  string local_7d8;
  string local_7b8;
  string local_798;
  string local_778;
  string local_758;
  string local_738;
  string local_718;
  string local_6f8;
  string local_6d8;
  string local_6b8;
  string local_698;
  string local_678;
  undefined1 local_658 [16];
  undefined1 local_648 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_638;
  undefined1 local_628 [64];
  ios_base local_5e8 [8];
  ios_base local_5e0 [1456];
  
  local_c88._44_4_ = in_EDI;
  std::__cxx11::string::string((string *)&local_af0,(char *)*in_RSI,(allocator *)local_658);
  local_960 = (_Base_ptr)local_950;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_960," - A evdev/uinput wrangler","");
  local_ae0._16_8_ = &local_ac0;
  if (local_af0 == (_Rb_tree_node_base *)local_ae0) {
    local_ac0._M_parent = (_Base_ptr)local_ae0._8_8_;
  }
  else {
    local_ae0._16_8_ = local_af0;
  }
  local_ac0._M_left = (_Base_ptr)local_aa0;
  if (local_960 == (_Base_ptr)local_950) {
    local_aa0._8_8_ = local_950._8_8_;
  }
  else {
    local_ac0._M_left = local_960;
  }
  local_a88._M_left = &local_a88;
  local_a60 = &local_a50;
  local_a40._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a40._M_impl.super__Rb_tree_header._M_header;
  local_950[0] = 0;
  local_958 = 0;
  local_a40._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a40._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a40._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a50._M_local_buf[0] = '\0';
  local_a58 = 0;
  local_a68 = 0;
  local_a88._M_parent = (_Base_ptr)0x0;
  local_a88._M_color = _S_red;
  local_ae0[0] = _S_red;
  local_ae8 = 0;
  local_bb0 = (Options *)local_ba0;
  local_af0 = (_Rb_tree_node_base *)local_ae0;
  local_a88._M_right = local_a88._M_left;
  local_a40._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a40._M_impl.super__Rb_tree_header._M_header._M_left;
  local_960 = (_Base_ptr)local_950;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_bb0,"");
  local_648._0_8_ = local_ba8;
  if (local_bb0 == (Options *)local_ba0) {
    local_c88._12_4_ = local_ba0._12_4_;
    local_c88._8_4_ = local_ba0._8_4_;
    local_c98._0_8_ = (Options *)local_c88;
  }
  else {
    local_c98._0_8_ = local_bb0;
  }
  local_c88._4_4_ = local_ba0._4_4_;
  local_c88._0_4_ = local_ba0._0_4_;
  local_c98._8_8_ = local_ba8;
  local_ba8 = (pointer)0x0;
  local_ba0._0_4_ = local_ba0._0_4_ & 0xffffff00;
  local_658._0_8_ = local_ae0 + 0x10;
  local_658._8_8_ = local_648 + 8;
  if ((Options *)local_c98._0_8_ == (Options *)local_c88) {
    aStack_638._M_allocated_capacity = local_c88._8_8_;
  }
  else {
    local_658._8_8_ = local_c98._0_8_;
  }
  local_c98._0_8_ = (Options *)local_c88;
  local_bb0 = (Options *)local_ba0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c98,"i,device","");
  local_c10._M_dataplus._M_p = (pointer)&local_c10.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c10,
             "Input device to read from, eg. /dev/input/event0, multiple can be provided","");
  cxxopts::value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>();
  local_970.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_b00;
  local_970.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Stack_af8;
  local_b00 = (_Base_ptr)0x0;
  p_Stack_af8 = (_Base_ptr)0x0;
  local_718._M_dataplus._M_p = (pointer)&local_718.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_718,"PATH","");
  pOVar10 = cxxopts::OptionAdder::operator()
                      ((OptionAdder *)local_658,(string *)local_c98,&local_c10,&local_970,&local_718
                      );
  local_cb8._M_dataplus._M_p = (pointer)&local_cb8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_cb8,"m,match-devices","");
  local_bf0._M_dataplus._M_p = (pointer)&local_bf0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_bf0,
             "Regular expression to match device strings (format: \'<vendor>,<product>,<version>,<name>\') with, matching will be read, multiple can be provided"
             ,"");
  cxxopts::value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>();
  local_980.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_b10;
  local_980.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_b08;
  local_b10 = (element_type *)0x0;
  p_Stack_b08 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_738._M_dataplus._M_p = (pointer)&local_738.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_738,"PATTERN","");
  pOVar10 = cxxopts::OptionAdder::operator()(pOVar10,&local_cb8,&local_bf0,&local_980,&local_738);
  local_c38._0_8_ = local_c48 + 0x20;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_c48 + 0x10),"r,roles","");
  local_c58._M_allocated_capacity = (size_type)(local_c88 + 0x40);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_c88 + 0x30),
             "A comma-separated list of role numbers. Roles will be assigned to devices in order of definition, path-based first. Devices matching a match-devices get one role."
             ,"");
  cxxopts::value<std::__cxx11::string>();
  local_990.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_b20._M_allocated_capacity;
  local_990.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b20._8_8_;
  local_b20._M_allocated_capacity = 0;
  local_b20._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_758._M_dataplus._M_p = (pointer)&local_758.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_758,"ROLES","");
  pOVar10 = cxxopts::OptionAdder::operator()
                      (pOVar10,(string *)(local_c48 + 0x10),(string *)(local_c88 + 0x30),&local_990,
                       &local_758);
  local_bd0._M_dataplus._M_p = (pointer)&local_bd0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_bd0,"p,plugin","");
  local_778._M_dataplus._M_p = (pointer)&local_778.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_778,"Path to plugin","");
  cxxopts::value<std::__cxx11::string>();
  local_9a0.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_b30._M_p;
  local_9a0.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_b28;
  local_b30._M_p = (pointer)0x0;
  p_Stack_b28 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_798,"PATH","");
  pOVar10 = cxxopts::OptionAdder::operator()(pOVar10,&local_bd0,&local_778,&local_9a0,&local_798);
  local_7b8._M_dataplus._M_p = (pointer)&local_7b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b8,"g,grab","");
  local_7d8._M_dataplus._M_p = (pointer)&local_7d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7d8,"Grab the input device, preventing others from accessing it","");
  cxxopts::value<bool>();
  local_9b0.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_b40;
  local_9b0.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_b38;
  local_b40 = (_Base_ptr)0x0;
  p_Stack_b38 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_7f8._M_dataplus._M_p = (pointer)&local_7f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f8,"");
  pOVar10 = cxxopts::OptionAdder::operator()(pOVar10,&local_7b8,&local_7d8,&local_9b0,&local_7f8);
  local_818._M_dataplus._M_p = (pointer)&local_818.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_818,"v,verbose","");
  local_838._M_dataplus._M_p = (pointer)&local_838.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_838,"Print extra runtime information","");
  cxxopts::value<bool>();
  local_9c0.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_b50;
  local_9c0.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Stack_b48;
  local_b50 = (_Base_ptr)0x0;
  p_Stack_b48 = (_Base_ptr)0x0;
  local_858._M_dataplus._M_p = (pointer)&local_858.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_858,"");
  pOVar10 = cxxopts::OptionAdder::operator()(pOVar10,&local_818,&local_838,&local_9c0,&local_858);
  local_878._M_dataplus._M_p = (pointer)&local_878.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_878,"d,daemonize","");
  local_898._M_dataplus._M_p = (pointer)&local_898.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_898,"Daemonize process","");
  cxxopts::value<bool>();
  local_9d0.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_b60;
  local_9d0.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_b58;
  local_b60 = (undefined1  [8])0x0;
  p_Stack_b58 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_8b8._M_dataplus._M_p = (pointer)&local_8b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8b8,"");
  pOVar10 = cxxopts::OptionAdder::operator()(pOVar10,&local_878,&local_898,&local_9d0,&local_8b8);
  local_8d8._M_dataplus._M_p = (pointer)&local_8d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d8,"l,list-devices","");
  local_8f8._M_dataplus._M_p = (pointer)&local_8f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8f8,"List available devices","");
  cxxopts::value<bool>();
  local_9e0.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_ba0._48_8_;
  local_9e0.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ba0._56_8_;
  local_ba0._48_8_ = 0;
  local_ba0._56_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_678._M_dataplus._M_p = (pointer)&local_678.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_678,"");
  pOVar10 = cxxopts::OptionAdder::operator()(pOVar10,&local_8d8,&local_8f8,&local_9e0,&local_678);
  local_918._M_dataplus._M_p = (pointer)&local_918.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_918,"X,plugin-parameter","");
  local_938._M_dataplus._M_p = (pointer)&local_938.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_950 + 0x18),"Plugin parameter","");
  cxxopts::value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>();
  local_9f0.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_ba0._32_8_;
  local_9f0.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ba0._40_8_;
  local_ba0._32_8_ = (pointer)0x0;
  local_ba0._40_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_698._M_dataplus._M_p = (pointer)&local_698.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_698,"ARG","");
  pOVar10 = cxxopts::OptionAdder::operator()
                      (pOVar10,&local_918,(string *)(local_950 + 0x18),&local_9f0,&local_698);
  local_6b8._M_dataplus._M_p = (pointer)&local_6b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6b8,"h,help","");
  local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6d8,"Print help","");
  cxxopts::value<bool>();
  local_a00.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_ba0._16_8_;
  local_a00.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ba0._24_8_;
  local_ba0._16_8_ = 0;
  local_ba0._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6f8,"");
  cxxopts::OptionAdder::operator()(pOVar10,&local_6b8,&local_6d8,&local_a00,&local_6f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
    operator_delete(local_6f8._M_dataplus._M_p);
  }
  if (local_a00.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a00.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ba0._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ba0._24_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
    operator_delete(local_6d8._M_dataplus._M_p);
  }
  paVar1 = &local_c10.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
    operator_delete(local_6b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_698._M_dataplus._M_p != &local_698.field_2) {
    operator_delete(local_698._M_dataplus._M_p);
  }
  if (local_9f0.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_9f0.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ba0._40_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ba0._40_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_938._M_dataplus._M_p != &local_938.field_2) {
    operator_delete(local_938._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_918._M_dataplus._M_p != &local_918.field_2) {
    operator_delete(local_918._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678._M_dataplus._M_p != &local_678.field_2) {
    operator_delete(local_678._M_dataplus._M_p);
  }
  if (local_9e0.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_9e0.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ba0._56_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ba0._56_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8f8._M_dataplus._M_p != &local_8f8.field_2) {
    operator_delete(local_8f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d8._M_dataplus._M_p != &local_8d8.field_2) {
    operator_delete(local_8d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8b8._M_dataplus._M_p != &local_8b8.field_2) {
    operator_delete(local_8b8._M_dataplus._M_p);
  }
  if (local_9d0.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_9d0.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_b58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_b58);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_898._M_dataplus._M_p != &local_898.field_2) {
    operator_delete(local_898._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_878._M_dataplus._M_p != &local_878.field_2) {
    operator_delete(local_878._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_858._M_dataplus._M_p != &local_858.field_2) {
    operator_delete(local_858._M_dataplus._M_p);
  }
  if (local_9c0.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_9c0.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_b48 != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Stack_b48);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838._M_dataplus._M_p != &local_838.field_2) {
    operator_delete(local_838._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_818._M_dataplus._M_p != &local_818.field_2) {
    operator_delete(local_818._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
    operator_delete(local_7f8._M_dataplus._M_p);
  }
  if (local_9b0.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_9b0.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_b38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_b38);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
    operator_delete(local_7d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b8._M_dataplus._M_p != &local_7b8.field_2) {
    operator_delete(local_7b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_798._M_dataplus._M_p != &local_798.field_2) {
    operator_delete(local_798._M_dataplus._M_p);
  }
  if (local_9a0.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_9a0.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_b28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_b28);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_778._M_dataplus._M_p != &local_778.field_2) {
    operator_delete(local_778._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bd0._M_dataplus._M_p != &local_bd0.field_2) {
    operator_delete(local_bd0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_758._M_dataplus._M_p != &local_758.field_2) {
    operator_delete(local_758._M_dataplus._M_p);
  }
  if (local_990.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_990.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b20._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b20._8_8_);
  }
  if ((undefined1 *)local_c58._M_allocated_capacity != local_c88 + 0x40) {
    operator_delete((void *)local_c58._M_allocated_capacity);
  }
  if ((_Base_ptr)local_c38._0_8_ != (_Base_ptr)(local_c48 + 0x20)) {
    operator_delete((void *)local_c38._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_738._M_dataplus._M_p != &local_738.field_2) {
    operator_delete(local_738._M_dataplus._M_p);
  }
  if (local_980.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_980.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_b08 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_b08);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bf0._M_dataplus._M_p != &local_bf0.field_2) {
    operator_delete(local_bf0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cb8._M_dataplus._M_p != &local_cb8.field_2) {
    operator_delete(local_cb8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_718._M_dataplus._M_p != &local_718.field_2) {
    operator_delete(local_718._M_dataplus._M_p);
  }
  if (local_970.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_970.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_af8 != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Stack_af8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c10._M_dataplus._M_p != paVar1) {
    operator_delete(local_c10._M_dataplus._M_p);
  }
  if ((Options *)local_c98._0_8_ != (Options *)local_c88) {
    operator_delete((void *)local_c98._0_8_);
  }
  if ((Options *)local_658._8_8_ != (Options *)(local_648 + 8)) {
    operator_delete((void *)local_658._8_8_);
  }
  if (local_bb0 != (Options *)local_ba0) {
    operator_delete(local_bb0);
  }
  if (local_c88._44_4_ == 1) {
    local_658._0_8_ = local_648;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_658,"");
    aStack_638._M_allocated_capacity = (size_type)local_628;
    std::__cxx11::string::_M_construct<char_const*>((string *)&aStack_638,"Group","");
    __l._M_len = 2;
    __l._M_array = (iterator)local_658;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_c10,__l,(allocator_type *)&local_cb8);
    cxxopts::Options::help
              ((string *)local_c98,(Options *)(local_ae0 + 0x10),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_c10);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(char *)local_c98._0_8_,local_c98._8_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    if ((Options *)local_c98._0_8_ != (Options *)local_c88) {
      operator_delete((void *)local_c98._0_8_);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_c10);
    lVar22 = 0;
    do {
      if (local_628 + lVar22 != *(undefined1 **)((long)&aStack_638 + lVar22)) {
        operator_delete(*(undefined1 **)((long)&aStack_638 + lVar22));
      }
      lVar22 = lVar22 + -0x20;
    } while (lVar22 != -0x40);
  }
  else {
    cxxopts::Options::parse
              ((Options *)(local_ae0 + 0x10),(int *)(local_c88 + 0x2c),(char ***)(local_950 + 0x10))
    ;
    local_658._0_8_ = (Options *)local_648;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_658,"v","");
    cVar12 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
                     *)(local_aa0 + 0x10),(key_type *)local_658);
    if (cVar12._M_node == &local_a88) {
      local_c88._36_4_ = 0;
    }
    else {
      local_c88._36_4_ =
           (undefined4)
           CONCAT71((int7)((ulong)*(long *)(cVar12._M_node + 2) >> 8),
                    0 < *(int *)(*(long *)(cVar12._M_node + 2) + 0x30));
    }
    if ((Options *)local_658._0_8_ != (Options *)local_648) {
      operator_delete((void *)local_658._0_8_);
    }
    local_658._0_8_ = (Options *)local_648;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_658,"h","");
    cVar12 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
                     *)(local_aa0 + 0x10),(key_type *)local_658);
    if (cVar12._M_node == &local_a88) {
      bVar24 = true;
    }
    else {
      bVar24 = *(int *)(*(long *)(cVar12._M_node + 2) + 0x30) == 0;
    }
    if ((Options *)local_658._0_8_ != (Options *)local_648) {
      operator_delete((void *)local_658._0_8_);
    }
    if (bVar24) {
      local_658._0_8_ = (Options *)local_648;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_658,"l","");
      cVar12 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
                       *)(local_aa0 + 0x10),(key_type *)local_658);
      if (cVar12._M_node == &local_a88) {
        bVar24 = true;
      }
      else {
        bVar24 = *(int *)(*(long *)(cVar12._M_node + 2) + 0x30) == 0;
      }
      if ((Options *)local_658._0_8_ != (Options *)local_648) {
        operator_delete((void *)local_658._0_8_);
      }
      if (!bVar24) {
        EvdevDevice::availableDevices();
        uVar5 = local_658._8_8_;
        for (pOVar20 = (Options *)local_658._0_8_; pOVar20 != (Options *)uVar5;
            pOVar20 = (Options *)
                      &(pOVar20->m_options)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
        {
          *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) =
               *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18))
               & 0xffffffb5 | 8;
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,
                               (char *)(pOVar20->m_help_string).field_2._M_allocated_capacity,
                               *(long *)((long)&(pOVar20->m_help_string).field_2 + 8));
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,": ",2);
          poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,",",1);
          poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,",",1);
          poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,",",1);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,(char *)(pOVar20->m_program).field_2._M_allocated_capacity,
                               *(long *)((long)&(pOVar20->m_program).field_2 + 8));
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
        }
        std::vector<EvdevDevice::Information,_std::allocator<EvdevDevice::Information>_>::~vector
                  ((vector<EvdevDevice::Information,_std::allocator<EvdevDevice::Information>_> *)
                   local_658);
        iVar9 = 0;
        goto LAB_0012115c;
      }
      local_658._0_8_ = (Options *)local_648;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_658,"i","");
      cVar12 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
                       *)(local_aa0 + 0x10),(key_type *)local_658);
      if (cVar12._M_node == &local_a88) {
        bVar24 = true;
      }
      else {
        bVar24 = *(int *)(*(long *)(cVar12._M_node + 2) + 0x30) < 1;
      }
      if (bVar24) {
        local_c10._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c10,"m","");
        cVar12 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
                         *)(local_aa0 + 0x10),&local_c10);
        if (cVar12._M_node == &local_a88) {
          bVar25 = true;
        }
        else {
          bVar25 = *(int *)(*(long *)(cVar12._M_node + 2) + 0x30) < 1;
        }
      }
      else {
        bVar25 = false;
      }
      if ((bVar24) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c10._M_dataplus._M_p != paVar1)) {
        operator_delete(local_c10._M_dataplus._M_p);
      }
      if ((Options *)local_658._0_8_ != (Options *)local_648) {
        operator_delete((void *)local_658._0_8_);
      }
      if (bVar25) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "ERROR: at least one input device path or match pattern is required",0x42);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x40);
        std::ostream::put(-0x40);
        iVar9 = 1;
        std::ostream::flush();
        goto LAB_0012115c;
      }
      local_658._0_8_ = (Options *)local_648;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_658,"p","");
      cVar12 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
                       *)(local_aa0 + 0x10),(key_type *)local_658);
      if (cVar12._M_node == &local_a88) {
        bVar24 = false;
      }
      else {
        bVar24 = *(int *)(*(long *)(cVar12._M_node + 2) + 0x30) == 1;
      }
      if ((Options *)local_658._0_8_ != (Options *)local_648) {
        operator_delete((void *)local_658._0_8_);
      }
      if (!bVar24) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"ERROR: exactly one plugin is required",0x25);
        iVar9 = 1;
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        goto LAB_0012115c;
      }
      local_c38._0_8_ = (_Base_ptr)0x0;
      local_c38._8_8_ = (_Base_ptr)0x0;
      local_c28[0] = (_Base_ptr)0x0;
      local_658._0_8_ = (Options *)local_648;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_658,"r","");
      cVar12 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
                       *)(local_aa0 + 0x10),(key_type *)local_658);
      if (cVar12._M_node == &local_a88) {
        bVar24 = true;
      }
      else {
        bVar24 = *(int *)(*(long *)(cVar12._M_node + 2) + 0x30) == 0;
      }
      if ((Options *)local_658._0_8_ != (Options *)local_648) {
        operator_delete((void *)local_658._0_8_);
      }
      if (bVar24) {
LAB_00121792:
        local_c58._M_allocated_capacity = 0;
        local_c58._8_8_ = (undefined8 *)0x0;
        local_c48._0_8_ = 0;
        local_658._0_8_ = (Options *)local_648;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_658,"i","");
        pOVar13 = cxxopts::Options::operator[]((Options *)(local_ae0 + 0x10),(string *)local_658);
        pvVar15 = cxxopts::OptionDetails::
                  as<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                            (pOVar13);
        if ((Options *)local_658._0_8_ != (Options *)local_648) {
          operator_delete((void *)local_658._0_8_);
        }
        pbVar17 = (pvVar15->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pbVar4 = (pvVar15->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        if (pbVar17 != pbVar4) {
          do {
            lVar22 = (long)(local_c58._8_8_ - local_c58._0_8_) >> 3;
            uVar19 = 0;
            if ((ulong)(lVar22 * -0x3333333333333333) <
                (ulong)((long)(local_c38._8_8_ - local_c38._0_8_) >> 2)) {
              uVar19 = *(undefined4 *)(local_c38._0_8_ + lVar22 * 0x3333333333333334);
            }
            pcVar3 = (pbVar17->_M_dataplus)._M_p;
            local_658._0_8_ = (Options *)local_648;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_658,pcVar3,pcVar3 + pbVar17->_M_string_length);
            aStack_638._M_allocated_capacity._0_4_ = uVar19;
            std::vector<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_>::
            emplace_back<EvdevDevice::Input>
                      ((vector<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_> *)
                       (local_c88 + 0x30),(Input *)local_658);
            if ((Options *)local_658._0_8_ != (Options *)local_648) {
              operator_delete((void *)local_658._0_8_);
            }
            pbVar17 = pbVar17 + 1;
          } while (pbVar17 != pbVar4);
        }
        local_658._0_8_ = (Options *)local_648;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_658,"m","");
        cVar12 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
                         *)(local_aa0 + 0x10),(key_type *)local_658);
        if (cVar12._M_node == &local_a88) {
          bVar24 = false;
        }
        else {
          bVar24 = 0 < *(int *)(*(long *)(cVar12._M_node + 2) + 0x30);
        }
        if ((Options *)local_658._0_8_ != (Options *)local_648) {
          operator_delete((void *)local_658._0_8_);
        }
        if (bVar24) {
          uVar23 = local_c58._8_8_ - local_c58._0_8_;
          EvdevDevice::availableDevices();
          local_658._0_8_ = (Options *)local_648;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_658,"m","");
          pOVar13 = cxxopts::Options::operator[]((Options *)(local_ae0 + 0x10),(string *)local_658);
          pvVar15 = cxxopts::OptionDetails::
                    as<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                              (pOVar13);
          if ((Options *)local_658._0_8_ != (Options *)local_648) {
            operator_delete((void *)local_658._0_8_);
          }
          pbVar17 = (pvVar15->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          local_a10 = (pvVar15->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          if (pbVar17 != local_a10) {
            local_c88._32_4_ = (int)(uVar23 >> 3) * -0x33333333;
            do {
              local_a08 = pbVar17;
              std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
              basic_regex<std::char_traits<char>,std::allocator<char>>
                        ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&local_cb8,pbVar17,
                         0x10);
              sVar7 = local_bd0._M_string_length;
              local_c88._40_4_ = _S_red;
              _Var21._M_p = local_bd0._M_dataplus._M_p;
              if ((ulong)(uint)local_c88._32_4_ <
                  (ulong)((long)(local_c38._8_8_ - local_c38._0_8_) >> 2)) {
                local_c88._40_4_ = ((_Rb_tree_color *)local_c38._0_8_)[(uint)local_c88._32_4_];
              }
              for (; _Var21._M_p != (pointer)sVar7;
                  _Var21._M_p = (pointer)((long)_Var21._M_p + 0x50)) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_658);
                *(uint *)((long)&role +
                         (long)&(*(_Base_ptr *)(local_658._0_8_ + -0x18))[-0x32]._M_color) =
                     *(uint *)((long)&role +
                              (long)&(*(_Base_ptr *)(local_658._0_8_ + -0x18))[-0x32]._M_color) &
                     0xffffffb5 | 8;
                poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)local_658);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,",",1);
                poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,",",1);
                poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,",",1);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,*(char **)(_Var21._M_p + 0x10),*(long *)(_Var21._M_p + 0x18));
                std::__cxx11::stringbuf::str();
                local_c88._0_4_ = 0;
                local_c88._4_4_ = 0;
                local_c88._8_8_ = (undefined1 *)0x0;
                local_c98._0_8_ = (Options *)0x0;
                local_c98._8_8_ = (pointer)0x0;
                bVar24 = std::__detail::
                         __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                                   ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     )local_bf0._M_dataplus._M_p,
                                    (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     )(local_bf0._M_dataplus._M_p +
                                      (long)(_Rb_tree_color *)local_bf0._M_string_length),
                                    (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     *)local_c98,
                                    (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                    &local_cb8,0);
                if ((Options *)local_c98._0_8_ != (Options *)0x0) {
                  operator_delete((void *)local_c98._0_8_);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_bf0._M_dataplus._M_p != &local_bf0.field_2) {
                  operator_delete(local_bf0._M_dataplus._M_p);
                }
                if (bVar24) {
                  local_c98._0_8_ = local_c88;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_c98,*(long *)(_Var21._M_p + 0x30),
                             *(long *)(_Var21._M_p + 0x38) + *(long *)(_Var21._M_p + 0x30));
                  local_c88._16_4_ = local_c88._40_4_;
                  std::vector<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_>::
                  emplace_back<EvdevDevice::Input>
                            ((vector<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_> *)
                             (local_c88 + 0x30),(Input *)local_c98);
                  if ((Options *)local_c98._0_8_ != (Options *)local_c88) {
                    operator_delete((void *)local_c98._0_8_);
                  }
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_658);
                std::ios_base::~ios_base(local_5e8);
              }
              local_c88._32_4_ = local_c88._32_4_ + 1;
              std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                        ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_cb8);
              pbVar17 = local_a08 + 1;
            } while (pbVar17 != local_a10);
          }
          std::vector<EvdevDevice::Information,_std::allocator<EvdevDevice::Information>_>::~vector
                    ((vector<EvdevDevice::Information,_std::allocator<EvdevDevice::Information>_> *)
                     &local_bd0);
        }
        uVar6 = local_c58._8_8_;
        uVar5 = local_c58._M_allocated_capacity;
        if (local_c88[0x24] != '\0') {
          for (; uVar5 != uVar6; uVar5 = (undefined8 *)(uVar5 + 0x28)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Using device ",0xd);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,*(char **)uVar5,*(long *)(uVar5 + 8));
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," with role ",0xb);
            poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
            std::ostream::put((char)poVar11);
            std::ostream::flush();
          }
        }
        EvdevDevice::EvdevDevice
                  ((EvdevDevice *)local_658,
                   (vector<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_> *)
                   (local_c88 + 0x30));
        p_evdev = (EvdevDevice *)local_658;
        if (local_658._0_8_ == local_658._8_8_) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"ERROR: Could not open input device",0x22);
          iVar9 = 1;
          std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        }
        else {
          local_cb8._M_dataplus._M_p = (pointer)&local_cb8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_cb8,"p","");
          pOVar13 = cxxopts::Options::operator[]((Options *)(local_ae0 + 0x10),&local_cb8);
          pbVar14 = cxxopts::OptionDetails::as<std::__cxx11::string>(pOVar13);
          FunKeyMonkeyModule::FunKeyMonkeyModule((FunKeyMonkeyModule *)local_c98,pbVar14);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_cb8._M_dataplus._M_p != &local_cb8.field_2) {
            operator_delete(local_cb8._M_dataplus._M_p);
          }
          if ((Options *)local_c98._0_8_ == (Options *)0x0) {
            lVar22 = 0x1c;
            pcVar18 = "ERROR: Could not open plugin";
LAB_00121e65:
            poVar11 = (ostream *)&std::cerr;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar18,lVar22)
            ;
LAB_00121e74:
            iVar9 = 1;
            std::endl<char,std::char_traits<char>>(poVar11);
          }
          else {
            local_cb8._M_dataplus._M_p = (pointer)&local_cb8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_cb8,"g","");
            cVar12 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
                             *)(local_aa0 + 0x10),&local_cb8);
            if ((cVar12._M_node == &local_a88) ||
               (*(int *)(*(long *)(cVar12._M_node + 2) + 0x30) == 0)) {
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_cb8._M_dataplus._M_p != &local_cb8.field_2) {
                operator_delete(local_cb8._M_dataplus._M_p);
              }
            }
            else {
              bVar24 = EvdevDevice::grab((EvdevDevice *)local_658,true);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_cb8._M_dataplus._M_p != &local_cb8.field_2) {
                operator_delete(local_cb8._M_dataplus._M_p);
              }
              if (!bVar24) {
                lVar22 = 0x22;
                pcVar18 = "ERROR: Could not grab input device";
                goto LAB_00121e65;
              }
            }
            local_cb8._M_dataplus._M_p = (pointer)&local_cb8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_cb8,"d","");
            cVar12 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
                             *)(local_aa0 + 0x10),&local_cb8);
            if ((cVar12._M_node == &local_a88) ||
               (*(int *)(*(long *)(cVar12._M_node + 2) + 0x30) == 0)) {
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_cb8._M_dataplus._M_p != &local_cb8.field_2) {
                operator_delete(local_cb8._M_dataplus._M_p);
              }
            }
            else {
              iVar9 = daemon(1,0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_cb8._M_dataplus._M_p != &local_cb8.field_2) {
                operator_delete(local_cb8._M_dataplus._M_p);
              }
              if (iVar9 == -1) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"ERROR: Could not daemonize, error code ",0x27);
                piVar16 = __errno_location();
                poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,*piVar16);
                goto LAB_00121e74;
              }
            }
            local_cb8._M_dataplus._M_p = (pointer)&local_cb8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_cb8,"X","");
            pOVar13 = cxxopts::Options::operator[]((Options *)(local_ae0 + 0x10),&local_cb8);
            pvVar15 = cxxopts::OptionDetails::
                      as<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                                (pOVar13);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_bf0,pvVar15);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_cb8._M_dataplus._M_p != &local_cb8.field_2) {
              operator_delete(local_cb8._M_dataplus._M_p);
            }
            process((EvdevDevice *)local_658,(FunKeyMonkeyModule *)local_c98,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_bf0);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_bf0);
            iVar9 = 0;
          }
          if ((Options *)local_c98._0_8_ != (Options *)0x0) {
            dlclose();
          }
        }
        EvdevDevice::~EvdevDevice((EvdevDevice *)local_658);
        std::vector<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_>::~vector
                  ((vector<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_> *)
                   (local_c88 + 0x30));
      }
      else {
        local_658._0_8_ = (Options *)local_648;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_658,"r","");
        pOVar13 = cxxopts::Options::operator[]((Options *)(local_ae0 + 0x10),(string *)local_658);
        pbVar14 = cxxopts::OptionDetails::as<std::__cxx11::string>(pOVar13);
        pcVar3 = (pbVar14->_M_dataplus)._M_p;
        local_c98._0_8_ = (Options *)local_c88;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_c98,pcVar3,pcVar3 + pbVar14->_M_string_length);
        if ((Options *)local_658._0_8_ != (Options *)local_648) {
          operator_delete((void *)local_658._0_8_);
        }
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)local_658,(string *)local_c98,_S_in);
        iVar9 = 0;
        do {
          uVar2 = *(uint *)((long)&aStack_638 + (long)*(_Base_ptr *)(local_658._0_8_ + -0x18));
          if ((uVar2 & 5) != 0) break;
          local_cb8._M_dataplus._M_p = local_cb8._M_dataplus._M_p & 0xffffffff00000000;
          std::istream::_M_extract<unsigned_int>((uint *)local_658);
          if ((aStack_638._M_local_buf[(long)*(_Base_ptr *)(local_658._0_8_ + -0x18)] & 5U) == 0) {
            if ((_Base_ptr)local_c38._8_8_ == local_c28[0]) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)(local_c48 + 0x10),
                         (iterator)local_c38._8_8_,(uint *)&local_cb8);
            }
            else {
              *(uint *)local_c38._8_8_ = (uint)local_cb8._M_dataplus._M_p;
              local_c38._8_8_ = local_c38._8_8_ + 4;
            }
            cVar8 = std::istream::get();
            bVar25 = (aStack_638._M_local_buf[(long)*(_Base_ptr *)(local_658._0_8_ + -0x18)] & 5U)
                     != 0;
            bVar24 = cVar8 == ',' || bVar25;
            if (cVar8 != ',' && !bVar25) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"ERROR: Invalid role list: ",0x1a);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,(char *)local_c98._0_8_,local_c98._8_8_);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
              std::ostream::put((char)poVar11);
              iVar9 = 1;
              std::ostream::flush();
            }
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"ERROR: Invalid role list: ",0x1a);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,(char *)local_c98._0_8_,local_c98._8_8_);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
            std::ostream::put((char)poVar11);
            std::ostream::flush();
            iVar9 = 1;
            bVar24 = false;
          }
        } while (bVar24);
        std::__cxx11::istringstream::~istringstream((istringstream *)local_658);
        std::ios_base::~ios_base(local_5e0);
        if ((Options *)local_c98._0_8_ != (Options *)local_c88) {
          operator_delete((void *)local_c98._0_8_);
        }
        if ((uVar2 & 5) != 0) goto LAB_00121792;
      }
      if ((_Base_ptr)local_c38._0_8_ != (_Base_ptr)0x0) {
        operator_delete((void *)local_c38._0_8_);
      }
      goto LAB_0012115c;
    }
    local_658._0_8_ = (Options *)local_648;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_658,"");
    aStack_638._M_allocated_capacity = (size_type)local_628;
    std::__cxx11::string::_M_construct<char_const*>((string *)&aStack_638,"Group","");
    __l_00._M_len = 2;
    __l_00._M_array = (iterator)local_658;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_c10,__l_00,(allocator_type *)&local_cb8);
    cxxopts::Options::help
              ((string *)local_c98,(Options *)(local_ae0 + 0x10),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_c10);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(char *)local_c98._0_8_,local_c98._8_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    if ((Options *)local_c98._0_8_ != (Options *)local_c88) {
      operator_delete((void *)local_c98._0_8_);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_c10);
    lVar22 = 0;
    do {
      if (local_628 + lVar22 != *(undefined1 **)((long)&aStack_638 + lVar22)) {
        operator_delete(*(undefined1 **)((long)&aStack_638 + lVar22));
      }
      lVar22 = lVar22 + -0x20;
    } while (lVar22 != -0x40);
  }
  iVar9 = 0;
LAB_0012115c:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails>_>_>
  ::~_Rb_tree(&local_a40);
  if (local_a60 != &local_a50) {
    operator_delete(local_a60);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
               *)(local_aa0 + 0x10));
  if (local_ac0._M_left != (_Base_ptr)local_aa0) {
    operator_delete(local_ac0._M_left);
  }
  if ((_Rb_tree_node_base *)local_ae0._16_8_ != &local_ac0) {
    operator_delete((void *)local_ae0._16_8_);
  }
  return iVar9;
}

Assistant:

int main(int argc, char** argv)
{
  cxxopts::Options options(argv[0], " - A evdev/uinput wrangler");
  options.add_options()
    ("i,device", "Input device to read from, eg. /dev/input/event0, multiple can be provided",
     cxxopts::value<std::vector<std::string>>(), "PATH")
    ("m,match-devices", "Regular expression to match device strings (format: '<vendor>,<product>,<version>,<name>') with, matching will be read, multiple can be provided",
     cxxopts::value<std::vector<std::string>>(), "PATTERN")
    ("r,roles", "A comma-separated list of role numbers. Roles will be assigned to devices in order of definition, path-based first. Devices matching a match-devices get one role.", cxxopts::value<std::string>(), "ROLES")
    ("p,plugin", "Path to plugin", cxxopts::value<std::string>(), "PATH")
    ("g,grab", "Grab the input device, preventing others from accessing it")
    ("v,verbose", "Print extra runtime information")
    ("d,daemonize", "Daemonize process")
    ("l,list-devices", "List available devices")
    ("X,plugin-parameter", "Plugin parameter",
     cxxopts::value<std::vector<std::string>>(), "ARG")
    ("h,help", "Print help");

  if(argc == 1)
  {
    std::cout << options.help({"", "Group"}) << std::endl;
    return EXIT_SUCCESS;
  }

  try
  {
    options.parse(argc, argv);
  }
  catch(cxxopts::OptionException e)
  {
    std::cerr << "ERROR: parsing options failed: " << e.what() << std::endl;
    return EXIT_FAILURE;
  }

  bool const verbose = options.count("v") > 0;

  if(options.count("h"))
  {
    std::cout << options.help({"", "Group"}) << std::endl;
    return EXIT_SUCCESS;
  }

  if(options.count("l"))
  {
    std::vector<EvdevDevice::Information> devices = EvdevDevice::availableDevices();
    for(EvdevDevice::Information const& device : devices)
    {
      std::cout << std::hex
        << device.path << ": "
        << device.vendor << ","
        << device.product << ","
        << device.version << ","
        << device.name << std::endl;
    }
    return EXIT_SUCCESS;
  }

  if(options.count("i") < 1 && options.count("m") < 1)
  {
    std::cerr << "ERROR: at least one input device path or match pattern is required" << std::endl;
    return EXIT_FAILURE;
  }

  if(options.count("p") != 1)
  {
    std::cerr << "ERROR: exactly one plugin is required" << std::endl;
    return EXIT_FAILURE;
  }

  std::vector<unsigned int> deviceRoles;
  if(options.count("r"))
  {
    std::string const roles = options["r"].as<std::string>();
    std::istringstream iss(roles);
    while(iss)
    {
      unsigned int role = 0;
      iss >> role;

      if(!iss)
      {
        std::cerr << "ERROR: Invalid role list: " << roles << std::endl;
        return EXIT_FAILURE;
      }

      deviceRoles.push_back(role);

      char separator = iss.get();
      if(iss && separator != ',')
      {
        std::cerr << "ERROR: Invalid role list: " << roles << std::endl;
        return EXIT_FAILURE;
      }
    }
  }

  std::vector<EvdevDevice::Input> inputs;
  for(std::string const& path : options["i"].as<std::vector<std::string>>())
  {
    unsigned int role = deviceRoles.size() > inputs.size() ? deviceRoles.at(inputs.size()) : 0;
    inputs.push_back({path, role});
  }

  if(options.count("m") > 0)
  {
    unsigned int roleIndex = inputs.size();
    std::vector<EvdevDevice::Information> devices = EvdevDevice::availableDevices();
    for(std::string const& pattern : options["m"].as<std::vector<std::string>>())
    {
      std::regex re(pattern);
      unsigned int role = deviceRoles.size() > roleIndex ? deviceRoles.at(roleIndex) : 0;
      for(EvdevDevice::Information const& info : devices)
      {
        std::ostringstream deviceString;
        deviceString << std::hex
          << info.vendor << ","
          << info.product << ","
          << info.version << ","
          << info.name;
        if(std::regex_search(deviceString.str(), re))
        {
          inputs.push_back({info.path, role});
        }
      }
      roleIndex += 1;
    }
  }

  if(verbose)
  {
    for(auto const& input : inputs)
    {
      std::cout << "Using device " << input.path << " with role " << input.role << std::endl;
    }
  }

  EvdevDevice evdev(inputs);
  p_evdev  = &evdev;

  if(!evdev.ready())
  {
    std::cerr << "ERROR: Could not open input device" << std::endl;
    return EXIT_FAILURE;
  }

  FunKeyMonkeyModule module(options["p"].as<std::string>());

  if(!module.ready())
  {
    std::cerr << "ERROR: Could not open plugin" << std::endl;
    return EXIT_FAILURE;
  }

  if(options.count("g") && !evdev.grab(true))
  {
    std::cerr << "ERROR: Could not grab input device" << std::endl;
    return EXIT_FAILURE;
  }

  if(options.count("d") && daemon(1, 0) == -1)
  {
    std::cerr << "ERROR: Could not daemonize, error code " << errno << std::endl;
    return EXIT_FAILURE;
  }

  std::vector<std::string> moduleArgs = options["X"].as<std::vector<std::string>>();

  process(evdev, module, moduleArgs);

  return EXIT_SUCCESS;
}